

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

args * djb::tab_r::extract_ggx_args(args *__return_storage_ptr__,tab_r *tab)

{
  tab_r *this;
  float_t fVar1;
  float fVar2;
  float_t fVar3;
  float extraout_XMM0_Da;
  double dVar4;
  args local_94;
  undefined1 local_48 [8];
  vec3 wm;
  float_t z_m;
  float_t zm;
  float_t tm;
  float_t u;
  int i;
  double nint;
  double du;
  tab_r *ptStack_10;
  int cnt;
  tab_r *tab_local;
  
  du._4_4_ = 0x200;
  ptStack_10 = tab;
  fVar1 = m_pi();
  nint = ((double)fVar1 * 4.0) / (double)du._4_4_;
  _u = 0.0;
  for (tm = 0.0; (int)tm < du._4_4_; tm = (float_t)((int)tm + 1)) {
    zm = (float)(int)tm / (float)du._4_4_;
    fVar2 = sqr<float>(&zm);
    fVar1 = m_pi();
    fVar2 = (fVar2 * fVar1) / 2.0;
    dVar4 = std::cos((double)(ulong)(uint)fVar2);
    wm.z = SUB84(dVar4,0);
    dVar4 = std::sin((double)(ulong)(uint)fVar2);
    wm.y = SUB84(dVar4,0);
    vec3::vec3((vec3 *)local_48,wm.y,0.0,wm.z);
    fVar1 = zm;
    fVar2 = sqr<float>(&wm.y);
    this = ptStack_10;
    microfacet::args::standard();
    fVar3 = microfacet::ndf((microfacet *)this,(vec3 *)local_48,&local_94);
    _u = (double)(fVar1 * fVar2 * fVar3) + _u;
  }
  _u = nint * _u;
  (*(ptStack_10->super_radial).super_microfacet.super_brdf._vptr_brdf[0xe])(0x3f800000);
  fVar1 = m_pi();
  _u = sqrt(1.0 / (double)(extraout_XMM0_Da * fVar1));
  fprintf(_stdout,"djb_verbose: GGX_alpha = %.9f\n",_u);
  microfacet::args::isotropic(__return_storage_ptr__,(float)_u);
  return __return_storage_ptr__;
}

Assistant:

microfacet::args tab_r::extract_ggx_args(const tab_r &tab)
{
	int cnt = 512;
	double du = 4 * (double)m_pi() / cnt;
	double nint = 0;

	for (int i = 0; i < cnt; ++i) {
		float_t u = (float_t)i / cnt;
		float_t tm = sqr(u) * m_pi() / 2;
		float_t zm = cos(tm), z_m = sin(tm);
		vec3 wm = vec3(z_m, 0, zm);

		nint+= (double)(u * sqr(z_m) * tab.ndf(wm));
	}
	nint*= du;

	nint = sqrt(1 / (double)(tab.ndf_std_radial(1) * m_pi()));

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: GGX_alpha = %.9f\n", nint);
#endif
	return microfacet::args::isotropic(nint);
}